

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  ulong uVar1;
  char *pcVar2;
  WhereTerm *pWVar3;
  
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  if (iColumn < 0 || pIdx == (Index *)0x0) {
    pScan->idxaff = '\0';
    pcVar2 = (char *)0x0;
  }
  else {
    pScan->idxaff = pIdx->pTable->aCol[(uint)iColumn].affinity;
    uVar1 = 0xffffffffffffffff;
    while (pIdx->aiColumn[uVar1 + 1] != iColumn) {
      uVar1 = uVar1 + 1;
      if (pIdx->nColumn < uVar1) {
        return (WhereTerm *)0x0;
      }
    }
    pcVar2 = pIdx->azColl[uVar1 + 1];
  }
  pScan->zCollName = pcVar2;
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aEquiv[0] = iCur;
  pScan->aEquiv[1] = iColumn;
  pScan->nEquiv = '\x02';
  pScan->iEquiv = '\x02';
  pWVar3 = whereScanNext(pScan);
  return pWVar3;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  int j;

  /* memset(pScan, 0, sizeof(*pScan)); */
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  if( pIdx && iColumn>=0 ){
    pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
    for(j=0; pIdx->aiColumn[j]!=iColumn; j++){
      if( NEVER(j>pIdx->nColumn) ) return 0;
    }
    pScan->zCollName = pIdx->azColl[j];
  }else{
    pScan->idxaff = 0;
    pScan->zCollName = 0;
  }
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aEquiv[0] = iCur;
  pScan->aEquiv[1] = iColumn;
  pScan->nEquiv = 2;
  pScan->iEquiv = 2;
  return whereScanNext(pScan);
}